

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O3

void __thiscall
S2Builder::Graph::EdgeProcessor::EdgeProcessor
          (EdgeProcessor *this,GraphOptions *options,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges,
          vector<int,_std::allocator<int>_> *input_ids,IdSetLexicon *id_set_lexicon)

{
  ulong uVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  long lVar4;
  undefined3 uVar5;
  DegenerateEdges DVar6;
  DuplicateEdges DVar7;
  SiblingPairs SVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ulong uVar12;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i_1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var13;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  long lVar14;
  int iVar18;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar19;
  undefined1 auVar21 [16];
  int iVar23;
  undefined1 auVar22 [16];
  allocator_type local_42;
  allocator_type local_41;
  vector<int,_std::allocator<int>_> *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  undefined1 auVar20 [16];
  
  uVar5 = *(undefined3 *)&options->field_0x11;
  (this->options_).allow_vertex_filtering_ = options->allow_vertex_filtering_;
  *(undefined3 *)&(this->options_).field_0x11 = uVar5;
  DVar6 = options->degenerate_edges_;
  DVar7 = options->duplicate_edges_;
  SVar8 = options->sibling_pairs_;
  (this->options_).edge_type_ = options->edge_type_;
  (this->options_).degenerate_edges_ = DVar6;
  (this->options_).duplicate_edges_ = DVar7;
  (this->options_).sibling_pairs_ = SVar8;
  this->edges_ = edges;
  this->input_ids_ = input_ids;
  this->id_set_lexicon_ = id_set_lexicon;
  local_38 = &this->out_edges_;
  std::vector<int,_std::allocator<int>_>::vector
            (local_38,(long)(edges->
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(edges->
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3,&local_41);
  local_40 = &this->in_edges_;
  std::vector<int,_std::allocator<int>_>::vector
            (local_40,(long)(this->edges_->
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->edges_->
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3,&local_42);
  (this->tmp_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->tmp_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->new_input_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->new_input_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->new_edges_).
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->new_edges_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->new_edges_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tmp_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  auVar11 = _DAT_00245de0;
  auVar10 = _DAT_00240670;
  auVar9 = _DAT_00240660;
  _Var2._M_current =
       (this->out_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  _Var3._M_current =
       (this->out_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (_Var2._M_current != _Var3._M_current) {
    lVar14 = (long)_Var3._M_current - (long)_Var2._M_current;
    uVar1 = lVar14 - 4;
    auVar22._8_4_ = (int)uVar1;
    auVar22._0_8_ = uVar1;
    auVar22._12_4_ = (int)(uVar1 >> 0x20);
    auVar15._0_8_ = uVar1 >> 2;
    auVar15._8_8_ = auVar22._8_8_ >> 2;
    uVar12 = 0;
    auVar15 = auVar15 ^ _DAT_00240670;
    do {
      iVar19 = (int)uVar12;
      auVar20._8_4_ = iVar19;
      auVar20._0_8_ = uVar12;
      auVar20._12_4_ = (int)(uVar12 >> 0x20);
      auVar22 = (auVar20 | auVar9) ^ auVar10;
      iVar18 = auVar15._4_4_;
      if ((bool)(~(iVar18 < auVar22._4_4_ ||
                  auVar15._0_4_ < auVar22._0_4_ && auVar22._4_4_ == iVar18) & 1)) {
        _Var2._M_current[uVar12] = iVar19;
      }
      if (auVar22._12_4_ <= auVar15._12_4_ &&
          (auVar22._8_4_ <= auVar15._8_4_ || auVar22._12_4_ != auVar15._12_4_)) {
        _Var2._M_current[uVar12 + 1] = iVar19 + 1;
      }
      auVar22 = (auVar20 | auVar11) ^ auVar10;
      iVar23 = auVar22._4_4_;
      if (iVar23 <= iVar18 && (iVar23 != iVar18 || auVar22._0_4_ <= auVar15._0_4_)) {
        _Var2._M_current[uVar12 + 2] = iVar19 + 2;
        _Var2._M_current[uVar12 + 3] = iVar19 + 3;
      }
      uVar12 = uVar12 + 4;
    } while (((uVar1 >> 2) + 4 & 0x7ffffffffffffffc) != uVar12);
    lVar4 = 0x3f;
    if (lVar14 >> 2 != 0) {
      for (; (ulong)(lVar14 >> 2) >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::EdgeProcessor::EdgeProcessor(S2Builder::GraphOptions_const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,IdSetLexicon*)::__0>>
              (_Var2,_Var3,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:891:51)>
                )this);
    if (lVar14 < 0x41) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::EdgeProcessor::EdgeProcessor(S2Builder::GraphOptions_const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,IdSetLexicon*)::__0>>
                (_Var2,_Var3,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:891:51)>
                  )this);
    }
    else {
      _Var13._M_current = _Var2._M_current + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::EdgeProcessor::EdgeProcessor(S2Builder::GraphOptions_const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,IdSetLexicon*)::__0>>
                (_Var2,_Var13,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:891:51)>
                  )this);
      for (; _Var13._M_current != _Var3._M_current; _Var13._M_current = _Var13._M_current + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Val_comp_iter<S2Builder::Graph::EdgeProcessor::EdgeProcessor(S2Builder::GraphOptions_const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,IdSetLexicon*)::__0>>
                  (_Var13,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:891:51)>
                           )this);
      }
    }
  }
  auVar11 = _DAT_00245de0;
  auVar10 = _DAT_00240670;
  auVar9 = _DAT_00240660;
  _Var2._M_current =
       (this->in_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  _Var3._M_current =
       (this->in_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (_Var2._M_current != _Var3._M_current) {
    lVar14 = (long)_Var3._M_current - (long)_Var2._M_current;
    uVar1 = lVar14 - 4;
    auVar16._8_4_ = (int)uVar1;
    auVar16._0_8_ = uVar1;
    auVar16._12_4_ = (int)(uVar1 >> 0x20);
    auVar17._0_8_ = uVar1 >> 2;
    auVar17._8_8_ = auVar16._8_8_ >> 2;
    uVar12 = 0;
    auVar17 = auVar17 ^ _DAT_00240670;
    do {
      iVar19 = (int)uVar12;
      auVar21._8_4_ = iVar19;
      auVar21._0_8_ = uVar12;
      auVar21._12_4_ = (int)(uVar12 >> 0x20);
      auVar22 = (auVar21 | auVar9) ^ auVar10;
      iVar18 = auVar17._4_4_;
      if ((bool)(~(auVar22._4_4_ == iVar18 && auVar17._0_4_ < auVar22._0_4_ ||
                  iVar18 < auVar22._4_4_) & 1)) {
        _Var2._M_current[uVar12] = iVar19;
      }
      if ((auVar22._12_4_ != auVar17._12_4_ || auVar22._8_4_ <= auVar17._8_4_) &&
          auVar22._12_4_ <= auVar17._12_4_) {
        _Var2._M_current[uVar12 + 1] = iVar19 + 1;
      }
      auVar22 = (auVar21 | auVar11) ^ auVar10;
      iVar23 = auVar22._4_4_;
      if (iVar23 <= iVar18 && (iVar23 != iVar18 || auVar22._0_4_ <= auVar17._0_4_)) {
        _Var2._M_current[uVar12 + 2] = iVar19 + 2;
        _Var2._M_current[uVar12 + 3] = iVar19 + 3;
      }
      uVar12 = uVar12 + 4;
    } while (((uVar1 >> 2) + 4 & 0x7ffffffffffffffc) != uVar12);
    lVar4 = 0x3f;
    if (lVar14 >> 2 != 0) {
      for (; (ulong)(lVar14 >> 2) >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::EdgeProcessor::EdgeProcessor(S2Builder::GraphOptions_const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,IdSetLexicon*)::__1>>
              (_Var2,_Var3,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:895:49)>
                )this);
    if (lVar14 < 0x41) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::EdgeProcessor::EdgeProcessor(S2Builder::GraphOptions_const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,IdSetLexicon*)::__1>>
                (_Var2,_Var3,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:895:49)>
                  )this);
    }
    else {
      _Var13._M_current = _Var2._M_current + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::EdgeProcessor::EdgeProcessor(S2Builder::GraphOptions_const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,IdSetLexicon*)::__1>>
                (_Var2,_Var13,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:895:49)>
                  )this);
      for (; _Var13._M_current != _Var3._M_current; _Var13._M_current = _Var13._M_current + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Val_comp_iter<S2Builder::Graph::EdgeProcessor::EdgeProcessor(S2Builder::GraphOptions_const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,IdSetLexicon*)::__1>>
                  (_Var13,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:895:49)>
                           )this);
      }
    }
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::reserve
            (&this->new_edges_,
             (long)(this->edges_->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->edges_->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3);
  std::vector<int,_std::allocator<int>_>::reserve
            (&this->new_input_ids_,
             (long)(this->edges_->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->edges_->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3);
  return;
}

Assistant:

Graph::EdgeProcessor::EdgeProcessor(const GraphOptions& options,
                                    vector<Edge>* edges,
                                    vector<InputEdgeIdSetId>* input_ids,
                                    IdSetLexicon* id_set_lexicon)
    : options_(options), edges_(*edges),
      input_ids_(*input_ids), id_set_lexicon_(id_set_lexicon),
      out_edges_(edges_.size()), in_edges_(edges_.size()) {
  // Sort the outgoing and incoming edges in lexigraphic order.  We use a
  // stable sort to ensure that each undirected edge becomes a sibling pair,
  // even if there are multiple identical input edges.
  std::iota(out_edges_.begin(), out_edges_.end(), 0);
  std::sort(out_edges_.begin(), out_edges_.end(), [this](EdgeId a, EdgeId b) {
      return StableLessThan(edges_[a], edges_[b], a, b);
    });
  std::iota(in_edges_.begin(), in_edges_.end(), 0);
  std::sort(in_edges_.begin(), in_edges_.end(), [this](EdgeId a, EdgeId b) {
      return StableLessThan(reverse(edges_[a]), reverse(edges_[b]), a, b);
    });
  new_edges_.reserve(edges_.size());
  new_input_ids_.reserve(edges_.size());
}